

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

bool protobuf_test_messages_proto2_TestAllTypesProto2_add_repeated_int32
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,int32_t val,upb_Arena *arena)

{
  bool bVar1;
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  upb_Arena *arena_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *ppStack_18;
  int32_t val_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  
  stack0xffffffffffffffcc = 0x1500000001f;
  field.number_dont_copy_me__upb_internal_use_only = 0xc105ffff;
  field._4_8_ = arena;
  arena_local._4_4_ = val;
  ppStack_18 = msg;
  array = upb_Message_GetOrCreateMutableArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4),arena);
  if ((array != (upb_Array *)0x0) &&
     (bVar1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                        (array,array->size_dont_copy_me__upb_internal_use_only + 1,
                         (upb_Arena *)field._4_8_), bVar1)) {
    _upb_Array_Set_dont_copy_me__upb_internal_use_only
              (array,array->size_dont_copy_me__upb_internal_use_only - 1,
               (void *)((long)&arena_local + 4),4);
    return true;
  }
  return false;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_add_repeated_int32(protobuf_test_messages_proto2_TestAllTypesProto2* msg, int32_t val, upb_Arena* arena) {
  upb_MiniTableField field = {31, UPB_SIZE(64, 336), 0, kUpb_NoSub, 5, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return false;
  }
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &val, sizeof(val));
  return true;
}